

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

void __thiscall
t_dart_generator::generate_serialize_field
          (t_dart_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  t_type *ttype;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  t_struct *tstruct;
  long lVar7;
  char *pcVar8;
  t_base_type *this_00;
  undefined1 auVar9 [12];
  string name;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  pcVar1 = (tfield->name_)._M_dataplus._M_p;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (tfield->name_)._M_string_length);
  paVar4 = local_b0;
  iVar3 = tolower((int)local_b0->_M_local_buf[0]);
  paVar4->_M_local_buf[0] = (char)iVar3;
  if (local_b0 == &local_a0) {
    local_d0.field_2._8_4_ = local_a0._8_4_;
    local_d0.field_2._12_4_ = local_a0._12_4_;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)local_b0;
  }
  local_d0._M_string_length = local_a8;
  local_a8 = 0;
  local_a0._M_allocated_capacity._0_4_ = local_a0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_b0 = &local_a0;
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar3 != '\0') {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&local_f0,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar6,&local_f0,&local_d0);
    __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar3 == '\0')) {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    if ((char)iVar3 != '\0') {
      std::operator+(&local_90,prefix,&local_d0);
      generate_serialize_container(this,out,ttype,&local_90);
      paVar4 = &local_90.field_2;
      goto LAB_001bd2ab;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    if (((char)iVar3 != '\0') ||
       (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype),
       _Var2._M_p = local_d0._M_dataplus._M_p, (char)iVar3 != '\0')) {
      std::operator+(&local_f0,prefix,&local_d0);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"oprot.",6);
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
        if ((char)iVar3 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32(",9);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
        }
      }
      else {
        this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
        lVar7 = 10;
        switch(this_00) {
        case (t_base_type *)0x0:
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar6,"compiler error: cannot serialize void field in a struct: ",
                         &local_f0);
          __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case (t_base_type *)0x1:
          iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
          pcVar8 = "writeString(";
          if ((char)iVar3 != '\0') {
            pcVar8 = "writeBinary(";
          }
          lVar7 = 0xc;
          break;
        case (t_base_type *)0x2:
          pcVar8 = "writeBool(";
          break;
        case (t_base_type *)0x3:
          pcVar8 = "writeByte(";
          break;
        case (t_base_type *)0x4:
          lVar7 = 9;
          pcVar8 = "writeI16(";
          break;
        case (t_base_type *)0x5:
          lVar7 = 9;
          pcVar8 = "writeI32(";
          break;
        case (t_base_type *)0x6:
          lVar7 = 9;
          pcVar8 = "writeI64(";
          break;
        case (t_base_type *)0x7:
          lVar7 = 0xc;
          pcVar8 = "writeDouble(";
          break;
        default:
          auVar9 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&local_50,this_00,auVar9._8_4_);
          std::operator+(auVar9._0_8_,"compiler error: no Dart name for base type ",&local_50);
          __cxa_throw(auVar9._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,lVar7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      paVar4 = &local_f0.field_2;
      goto LAB_001bd2ab;
    }
    pcVar1 = (prefix->_M_dataplus)._M_p;
    type_name_abi_cxx11_(&local_f0,this,ttype);
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",pcVar1,_Var2._M_p,
           local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_001bd2b9;
  }
  else {
    std::operator+(&local_70,prefix,&local_d0);
    generate_serialize_struct(this,out,tstruct,&local_70);
    paVar4 = &local_70.field_2;
LAB_001bd2ab:
    local_f0._M_dataplus._M_p = *(pointer *)(paVar4->_M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == paVar4) goto LAB_001bd2b9;
  }
  operator_delete(local_f0._M_dataplus._M_p);
LAB_001bd2b9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());
  string field_name = get_member_name(tfield->get_name());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + field_name;
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + field_name);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + field_name);
  } else if (type->is_base_type() || type->is_enum()) {

    string name = prefix + field_name;
    indent(out) << "oprot.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "writeBinary(" << name << ");";
        } else {
          out << "writeString(" << name << ");";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ");";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ");";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ");";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ");";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ");";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ");";
        break;
      default:
        throw "compiler error: no Dart name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ");";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           field_name.c_str(),
           type_name(type).c_str());
  }
}